

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O3

bool __thiscall duckdb::BoundCastExpression::CanThrow(BoundCastExpression *this)

{
  bool bVar1;
  pointer pEVar2;
  LogicalTypeId LVar3;
  bool changes_type;
  LogicalType child_type;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  LogicalType local_48;
  LogicalType local_30;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&this->child);
  LogicalType::LogicalType(&local_30,&pEVar2->return_type);
  if ((this->super_Expression).return_type.id_ != local_30.id_) {
    LogicalType::ForceMaxLogicalType
              ((LogicalType *)&local_68,&(this->super_Expression).return_type,&local_30);
    LogicalType::LogicalType(&local_48,local_30.id_);
    bVar1 = LogicalType::operator==((LogicalType *)&local_68,&local_48);
    LogicalType::~LogicalType(&local_48);
    LogicalType::~LogicalType((LogicalType *)&local_68);
    LVar3 = SQLNULL;
    if (bVar1) goto LAB_006af904;
  }
  local_68._M_unused._M_object = &local_48;
  local_48.id_ = INVALID;
  local_68._8_8_ = 0;
  local_50 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_cast_expression.cpp:228:47)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_cast_expression.cpp:228:47)>
             ::_M_manager;
  ExpressionIterator::EnumerateChildren
            (&this->super_Expression,(function<void_(const_duckdb::Expression_&)> *)&local_68);
  LVar3 = local_48.id_;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
    LVar3 = local_48.id_;
  }
LAB_006af904:
  LogicalType::~LogicalType(&local_30);
  return (bool)LVar3;
}

Assistant:

bool BoundCastExpression::CanThrow() const {
	const auto child_type = child->return_type;
	if (return_type.id() != child_type.id() &&
	    LogicalType::ForceMaxLogicalType(return_type, child_type) == child_type.id()) {
		return true;
	}
	bool changes_type = false;
	ExpressionIterator::EnumerateChildren(*this, [&](const Expression &child) { changes_type |= child.CanThrow(); });
	return changes_type;
}